

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string example_struct_end;
  string example_struct_begin;
  string shader_source;
  long *local_148 [2];
  long local_138 [2];
  SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::ES> *local_128;
  TestShaderType local_11c;
  undefined8 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  long *local_f0 [2];
  long local_e0 [2];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_d0 = local_c0;
  local_128 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"struct light {\n","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"};\n\n","");
  local_118 = 1;
  local_50[0] = local_40;
  local_11c = tested_shader_type;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_d0,local_d0 + local_c8);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"    float","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"[2]","");
  (*(local_128->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_148,local_128,local_f0,(string *)local_70,local_118);
  std::__cxx11::string::_M_append((char *)local_50,(ulong)local_148[0]);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90," x","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"[2]","");
  (*(local_128->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_148,local_128,(string *)local_90,(string *)local_b0,7);
  std::__cxx11::string::_M_append((char *)local_50,(ulong)local_148[0]);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::_M_append((char *)local_50,(ulong)local_110[0]);
  std::__cxx11::string::_M_append((char *)local_50,shader_start_abi_cxx11_);
  if (local_11c < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01ad30c8 + *(int *)(&DAT_01ad30c8 + (ulong)tested_shader_type * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x645);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SizedDeclarationsTypenameStyle4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct_begin("struct light {\n");
	std::string example_struct_end("};\n\n");

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = example_struct_begin;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";
		shader_source += example_struct_end;
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}